

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * __thiscall
soul::Value::getSubElement(Value *__return_storage_ptr__,Value *this,SubElementPath *path)

{
  ArrayWithPreallocation<unsigned_char,_8UL> *this_00;
  TypeAndOffset typeAndOffset;
  Type local_50;
  TypeAndOffset local_38;
  
  SubElementPath::getElement(&local_38,path,&this->type);
  local_50.category = local_38.type.category;
  local_50.arrayElementCategory = local_38.type.arrayElementCategory;
  local_50.isRef = local_38.type.isRef;
  local_50.isConstant = local_38.type.isConstant;
  local_50.primitiveType.type = local_38.type.primitiveType.type;
  local_50.boundingSize = local_38.type.boundingSize;
  local_50.arrayElementBoundingSize = local_38.type.arrayElementBoundingSize;
  local_50.structure.object = local_38.type.structure.object;
  local_38.type.structure.object = (Structure *)0x0;
  this_00 = &(this->allocatedData).allocatedData;
  if ((this->allocatedData).allocatedData.numActive == 0) {
    ArrayWithPreallocation<unsigned_char,_8UL>::resize(this_00,(this->allocatedData).allocatedSize);
  }
  Value(__return_storage_ptr__,&local_50,this_00->items + local_38.offset);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_50.structure.object);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_38.type.structure.object);
  return __return_storage_ptr__;
}

Assistant:

Value Value::getSubElement (const SubElementPath& path) const
{
    auto typeAndOffset = path.getElement (type);
    return Value (std::move (typeAndOffset.type), allocatedData.data() + typeAndOffset.offset);
}